

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::impl::anon_unknown_0::xml_buffered_writer::write_string
          (xml_buffered_writer *this,char_t *data)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  
  for (uVar5 = this->bufsize; (cVar1 = *data, cVar1 != '\0' && (uVar5 < 0x800)); uVar5 = uVar5 + 1)
  {
    data = data + 1;
    this->buffer[uVar5] = cVar1;
  }
  if (uVar5 < 0x800) {
    this->bufsize = uVar5;
    return;
  }
  sVar2 = this->bufsize;
  sVar3 = get_valid_length(data + (sVar2 - uVar5),uVar5 - sVar2);
  this->bufsize = sVar3 + sVar2;
  sVar4 = strlen(data);
  write_direct(this,data + ((sVar3 + sVar2) - uVar5),uVar5 + ((sVar4 - sVar3) - sVar2));
  return;
}

Assistant:

void write_string(const char_t* data)
		{
			// write the part of the string that fits in the buffer
			size_t offset = bufsize;

			while (*data && offset < bufcapacity)
				buffer[offset++] = *data++;

			// write the rest
			if (offset < bufcapacity)
			{
				bufsize = offset;
			}
			else
			{
				// backtrack a bit if we have split the codepoint
				size_t length = offset - bufsize;
				size_t extra = length - get_valid_length(data - length, length);

				bufsize = offset - extra;

				write_direct(data - extra, strlength(data) + extra);
			}
		}